

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_FillRevSubClampColumn(void)

{
  int iVar1;
  DWORD DVar2;
  DWORD *pDVar3;
  uint uVar4;
  uint uVar5;
  DWORD b;
  DWORD a;
  int pitch;
  DWORD fg;
  DWORD *bg2rgb;
  BYTE *dest;
  int count;
  
  pDVar3 = dc_destblend;
  DVar2 = dc_srccolor;
  iVar1 = dc_pitch;
  dest._4_4_ = dc_count;
  if (0 < dc_count) {
    bg2rgb = (DWORD *)dc_dest;
    do {
      uVar4 = (pDVar3[(byte)*bg2rgb] | 0x40100400) - DVar2;
      uVar5 = uVar4 & 0x40100400;
      uVar4 = uVar5 - (uVar5 >> 5) & uVar4 | 0x1f07c1f;
      *(BYTE *)bg2rgb = RGB32k.All[uVar4 & uVar4 >> 0xf];
      bg2rgb = (DWORD *)((long)bg2rgb + (long)iVar1);
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void R_FillRevSubClampColumn (void)
{
	int count;
	BYTE *dest;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;
	DWORD *bg2rgb;
	DWORD fg;

	bg2rgb = dc_destblend;
	fg = dc_srccolor;
	int pitch = dc_pitch;

	do
	{
		DWORD a = (bg2rgb[*dest] | 0x40100400) - fg;
		DWORD b = a;

		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		*dest = RGB32k.All[a & (a>>15)];
		dest += pitch; 
	} while (--count);

}